

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

bool __thiscall
crnlib::etc1_optimizer::evaluate_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  params *ppVar5;
  color_quad_u8 *pcVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  undefined4 *puVar16;
  uint uVar17;
  long lVar18;
  uchar uVar19;
  color_quad_u8 base_color;
  color_quad_u8 block_colors [4];
  
  trial_solution->m_valid = false;
  ppVar5 = this->m_pParams;
  if (ppVar5->m_constrain_against_base_color5 == true) {
    iVar7 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
            (uint)(ppVar5->m_base_color5).field_0.field_0.r;
    iVar13 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar5->m_base_color5).field_0.field_0.g;
    iVar10 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar5->m_base_color5).field_0.field_0.b;
    iVar14 = iVar13;
    if (iVar7 < iVar13) {
      iVar14 = iVar7;
    }
    if (iVar10 <= iVar14) {
      iVar14 = iVar10;
    }
    if (iVar14 < -4) {
      return false;
    }
    if (iVar13 < iVar7) {
      iVar13 = iVar7;
    }
    if (iVar13 <= iVar10) {
      iVar13 = iVar10;
    }
    if (3 < iVar13) {
      return false;
    }
  }
  etc1_solution_coordinates::get_scaled_color((etc1_solution_coordinates *)&base_color);
  uVar4 = this->m_pParams->m_num_src_pixels;
  trial_solution->m_error = 0xffffffffffffffff;
  puVar16 = &g_etc1_inten_tables;
  lVar9 = 0;
  do {
    if (lVar9 == 8) {
      (trial_solution->m_coords).m_unscaled_color.field_0.field_0.r =
           (coords->m_unscaled_color).field_0.field_0.r;
      (trial_solution->m_coords).m_unscaled_color.field_0.field_0.g =
           (coords->m_unscaled_color).field_0.field_0.g;
      (trial_solution->m_coords).m_unscaled_color.field_0.field_0.b =
           (coords->m_unscaled_color).field_0.field_0.b;
      (trial_solution->m_coords).m_unscaled_color.field_0.field_0.a =
           (coords->m_unscaled_color).field_0.field_0.a;
      (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
      if ((pBest_solution != (potential_solution *)0x0) &&
         (trial_solution->m_error < pBest_solution->m_error)) {
        potential_solution::operator=(pBest_solution,trial_solution);
        return true;
      }
      return false;
    }
    for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 4) {
      iVar14 = *(int *)((long)puVar16 + lVar18);
      color_quad<unsigned_char,_int>::set
                ((color_quad<unsigned_char,_int> *)((long)&block_colors[0].field_0 + lVar18),
                 (uint)base_color.field_0.field_0.r + iVar14,
                 (uint)base_color.field_0.field_0.g + iVar14,
                 (uint)base_color.field_0.field_0.b + iVar14,0);
    }
    pcVar6 = this->m_pParams->m_pSrc_pixels;
    uVar8 = 0;
    for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
      bVar1 = pcVar6[uVar11].field_0.field_0.r;
      iVar14 = (uint)bVar1 - (uint)(byte)block_colors[0].field_0._0_1_;
      bVar2 = pcVar6[uVar11].field_0.field_0.g;
      iVar13 = (uint)bVar2 - (uint)(byte)block_colors[0].field_0._1_1_;
      bVar3 = pcVar6[uVar11].field_0.field_0.b;
      iVar7 = (uint)bVar3 - (uint)(byte)block_colors[0].field_0._2_1_;
      uVar17 = iVar7 * iVar7 + iVar13 * iVar13 + iVar14 * iVar14;
      iVar13 = (uint)bVar1 - (uint)(byte)block_colors[1].field_0._0_1_;
      iVar14 = (uint)bVar2 - (uint)(byte)block_colors[1].field_0._1_1_;
      iVar7 = (uint)bVar3 - (uint)(byte)block_colors[1].field_0._2_1_;
      uVar15 = iVar7 * iVar7 + iVar14 * iVar14 + iVar13 * iVar13;
      uVar19 = uVar15 < uVar17;
      if (!(bool)uVar19) {
        uVar15 = uVar17;
      }
      iVar14 = (uint)bVar1 - (uint)(byte)block_colors[2].field_0._0_1_;
      iVar7 = (uint)bVar2 - (uint)(byte)block_colors[2].field_0._1_1_;
      iVar13 = (uint)bVar3 - (uint)(byte)block_colors[2].field_0._2_1_;
      uVar17 = iVar13 * iVar13 + iVar7 * iVar7 + iVar14 * iVar14;
      if (uVar17 < uVar15) {
        uVar19 = '\x02';
        uVar15 = uVar17;
      }
      iVar7 = (uint)bVar1 - (uint)(byte)block_colors[3].field_0._0_1_;
      iVar14 = (uint)bVar2 - (uint)(byte)block_colors[3].field_0._1_1_;
      iVar13 = (uint)bVar3 - (uint)(byte)block_colors[3].field_0._2_1_;
      uVar17 = iVar13 * iVar13 + iVar14 * iVar14 + iVar7 * iVar7;
      if (uVar17 < uVar15) {
        uVar19 = '\x03';
        uVar15 = uVar17;
      }
      (this->m_temp_selectors).m_p[uVar11] = uVar19;
      uVar8 = uVar8 + uVar15;
      uVar12 = trial_solution->m_error;
      if (uVar12 <= uVar8) goto LAB_00178b63;
    }
    uVar12 = trial_solution->m_error;
LAB_00178b63:
    if (uVar8 < uVar12) {
      trial_solution->m_error = uVar8;
      (trial_solution->m_coords).m_inten_table = (uint)lVar9;
      vector<unsigned_char>::swap(&trial_solution->m_selectors,&this->m_temp_selectors);
      trial_solution->m_valid = true;
    }
    lVar9 = lVar9 + 1;
    puVar16 = puVar16 + 4;
  } while( true );
}

Assistant:

bool etc1_optimizer::evaluate_solution(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  trial_solution.m_valid = false;

  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
      return false;
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = m_pParams->m_num_src_pixels;
  CRNLIB_ASSERT(trial_solution.m_selectors.size() == n);

  trial_solution.m_error = cUINT64_MAX;

  for (uint inten_table = 0; inten_table < cETC1IntenModifierValues; inten_table++) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      block_colors[s].set(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
    }

    uint64 total_error = 0;

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    for (uint c = 0; c < n; c++) {
      const color_quad_u8& src_pixel = *pSrc_pixels++;

      uint best_selector_index = 0;
      uint best_error = math::square(src_pixel.r - block_colors[0].r) + math::square(src_pixel.g - block_colors[0].g) + math::square(src_pixel.b - block_colors[0].b);

      uint trial_error = math::square(src_pixel.r - block_colors[1].r) + math::square(src_pixel.g - block_colors[1].g) + math::square(src_pixel.b - block_colors[1].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 1;
      }

      trial_error = math::square(src_pixel.r - block_colors[2].r) + math::square(src_pixel.g - block_colors[2].g) + math::square(src_pixel.b - block_colors[2].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 2;
      }

      trial_error = math::square(src_pixel.r - block_colors[3].r) + math::square(src_pixel.g - block_colors[3].g) + math::square(src_pixel.b - block_colors[3].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 3;
      }

      m_temp_selectors[c] = static_cast<uint8>(best_selector_index);

      total_error += best_error;
      if (total_error >= trial_solution.m_error)
        break;
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      trial_solution.m_selectors.swap(m_temp_selectors);
      trial_solution.m_valid = true;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}